

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  InplaceStr *this_00;
  InplaceStr local_48;
  
  local_48.begin = (char *)0x0;
  local_48.end = (char *)0x0;
  bVar2 = InplaceStr::operator==(key,&local_48);
  if (bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<InplaceStr, InplaceStrHasher, 2>::insert(const Key &) [Key = InplaceStr, Hasher = InplaceStrHasher, N = 2]"
                 );
  }
  uVar5 = this->bucketCount;
  if (uVar5 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar5 = this->bucketCount;
  }
  uVar3 = NULLC::GetStringHash(key->begin,key->end);
  if (this->bucketCount != 0) {
    uVar4 = 0;
    do {
      uVar3 = uVar3 & uVar5 - 1;
      this_00 = this->data + uVar3;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar2 = InplaceStr::operator==(this_00,&local_48);
      if (bVar2) {
        pcVar1 = key->end;
        this_00->begin = key->begin;
        this_00->end = pcVar1;
        this->count = this->count + 1;
        return;
      }
      bVar2 = InplaceStr::operator==(this_00,key);
      if (bVar2) {
        return;
      }
      uVar3 = uVar3 + uVar4 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucketCount);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0xf5,
                "void SmallDenseSet<InplaceStr, InplaceStrHasher, 2>::insert(const Key &) [Key = InplaceStr, Hasher = InplaceStrHasher, N = 2]"
               );
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}